

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O1

string * tokens_to_str<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                   (string *__return_storage_ptr__,llama_context *ctx,
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (begin._M_current != end._M_current) {
    do {
      common_token_to_piece_abi_cxx11_(&local_50,ctx,*begin._M_current,true);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      begin._M_current = begin._M_current + 1;
    } while (begin._M_current != end._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string tokens_to_str(llama_context * ctx, Iter begin, Iter end) {
    std::string ret;
    for (; begin != end; ++begin) {
        ret += common_token_to_piece(ctx, *begin);
    }

    return ret;
}